

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_is_object(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  jx9_real jVar1;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) {
    jVar1 = 0.0;
  }
  else {
    jVar1 = (jx9_real)(ulong)(*(uint *)(((*apArg)->x).iVal + 0x40) & 1);
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar1;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_is_object(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int res = 0; /* Assume false by default */
	if( nArg > 0 ){
		res = jx9_value_is_json_object(apArg[0]);
	}
	/* Query result */
	jx9_result_bool(pCtx, res);
	return JX9_OK;
}